

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# String.cpp
# Opt level: O1

istream * L12_1::operator>>(istream *is,String *str)

{
  int iVar1;
  char temp [80];
  undefined1 auStack_68 [88];
  
  std::ios::widen((char)*(undefined8 *)(*(long *)is + -0x18) + (char)is);
  std::istream::get((char *)is,(long)auStack_68,'P');
  if (((byte)is[*(long *)(*(long *)is + -0x18) + 0x20] & 5) == 0) {
    operator_delete__(str->_p_str);
  }
  do {
    if (((byte)is[*(long *)(*(long *)is + -0x18) + 0x20] & 5) != 0) {
      return is;
    }
    iVar1 = std::istream::get();
  } while (iVar1 != 10);
  return is;
}

Assistant:

std::istream& operator>>(std::istream &is, String &str) {
        char temp[String::CIN_LIMIT];
        //  取一定长度的字符，存到 temp 里
        is.get(temp, String::CIN_LIMIT);
        if (is) {
            //  赋值给 string 对象
            str = temp;
        }
        //  有内容且下一个内容不是换行符 => 一直读到没内容/下一个内容是换行符时，return
        while(is && is.get() != '\n') {
            continue;
        }
        return is;
    }